

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteBlock.cpp
# Opt level: O2

ByteBlock *
Js::ByteBlock::New(Recycler *alloc,byte *initialContent,int initialContentSize,
                  ScriptContext *requestContext)

{
  uchar *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Recycler *alloc_00;
  ByteBlock *this;
  Var pvVar5;
  size_t i;
  long lVar6;
  Var *src;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  if (initialContentSize < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteBlock.cpp"
                                ,0x4f,"(initialContentSize > 0)","Must have valid data size");
    if (!bVar3) {
LAB_007478ca:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  local_70 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_3446dad;
  data.filename._0_4_ = 0x51;
  alloc_00 = Memory::Recycler::TrackAllocInfo(alloc,(TrackAllocData *)local_70);
  this = (ByteBlock *)new<Memory::Recycler>(0x10,alloc_00,0x37a1d4);
  ByteBlock(this,initialContentSize,alloc);
  if (initialContent != (byte *)0x0) {
    puVar1 = (this->m_content).ptr;
    data._32_8_ = (ulong)(long)initialContentSize >> 3;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (lVar6 = 0; data._32_8_ != lVar6; lVar6 = lVar6 + 1) {
      bVar3 = TaggedInt::Is(*(Var *)(initialContent + lVar6 * 8));
      pvVar5 = *(Var *)(initialContent + lVar6 * 8);
      if (bVar3) {
        *(Var *)(puVar1 + lVar6 * 8) = pvVar5;
      }
      else {
        if ((ulong)pvVar5 >> 0x32 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteBlock.cpp"
                                      ,0x6d,"(JavascriptNumber::Is(src[i]))",
                                      "JavascriptNumber::Is(src[i])");
          if (!bVar3) goto LAB_007478ca;
          *puVar4 = 0;
          pvVar5 = *(Var *)(initialContent + lVar6 * 8);
        }
        pvVar5 = JavascriptNumber::CloneToScriptContext(pvVar5,requestContext);
        *(Var *)(puVar1 + lVar6 * 8) = pvVar5;
        ScriptContext::BindReference(requestContext,pvVar5);
      }
    }
  }
  return this;
}

Assistant:

ByteBlock *ByteBlock::New(Recycler *alloc, const byte * initialContent, int initialContentSize, ScriptContext * requestContext)
    {
        // initialContent may be 'null' if no data to copy
        AssertMsg(initialContentSize > 0, "Must have valid data size");

        ByteBlock *newBlock = RecyclerNew(alloc, ByteBlock, initialContentSize, alloc);

        //
        // Copy any optional data into the block:
        // - If initialContent was not provided, the block's contents will be uninitialized.
        //
        if (initialContent != nullptr)
        {
            //
            // Treat initialContent as array of vars
            // Clone vars to the requestContext
            //

            Var *src = (Var*)initialContent;
            Var *dst = (Var*)(byte*)newBlock->m_content;
            size_t count = initialContentSize / sizeof(Var);

            for (size_t i = 0; i < count; i++)
            {
                if (TaggedInt::Is(src[i]))
                {
                    dst[i] = src[i];
                }
                else
                {
                    //
                    // Currently only numbers are put into AuxiliaryContext data
                    //
                    Assert(JavascriptNumber::Is(src[i]));
                    dst[i] = JavascriptNumber::CloneToScriptContext(src[i], requestContext);
                    requestContext->BindReference(dst[i]);
                }
            }
        }

        return newBlock;
    }